

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O0

void p_ere_exp(parse *p)

{
  char cVar1;
  char *pcVar2;
  long pos_00;
  size_t opnd;
  int from;
  ushort **ppuVar3;
  bool bVar4;
  int wascaret;
  sopno subno;
  int count2;
  int count;
  sopno pos;
  char c;
  parse *p_local;
  
  bVar4 = false;
  if (p->end <= p->next) {
    __assert_fail("MORE()",
                  "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                  ,0x10f,"void p_ere_exp()");
  }
  pcVar2 = p->next;
  p->next = pcVar2 + 1;
  cVar1 = *pcVar2;
  pos_00 = p->slen;
  switch(cVar1) {
  case '$':
    doemit(p,0x10000000,0);
    p->g->iflags = p->g->iflags | 2;
    p->g->neol = p->g->neol + 1;
    break;
  case '(':
    if (p->end <= p->next) {
      seterr(p,8);
    }
    p->g->nsub = p->g->nsub + 1;
    opnd = p->g->nsub;
    if ((long)opnd < 10) {
      p->pbegin[opnd] = p->slen;
    }
    doemit(p,0x34000000,opnd);
    if ((p->end <= p->next) || (*p->next != ')')) {
      p_ere(p,0x29);
    }
    if (((long)opnd < 10) && (p->pend[opnd] = p->slen, p->pend[opnd] == 0)) {
      __assert_fail("p->pend[subno] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/garyhouston[P]rxspencer/regcomp.c"
                    ,0x11f,"void p_ere_exp()");
    }
    doemit(p,0x38000000,opnd);
    if ((p->end <= p->next) || (pcVar2 = p->next, p->next = pcVar2 + 1, *pcVar2 != ')')) {
      seterr(p,8);
    }
    break;
  case '*':
  case '+':
  case '?':
    seterr(p,0xd);
    break;
  case '.':
    if ((p->g->cflags & 8U) == 0) {
      doemit(p,0x14000000,0);
    }
    else {
      nonnewline(p);
    }
    break;
  case '[':
    p_bracket(p);
    break;
  case '\\':
    if (p->end <= p->next) {
      seterr(p,5);
    }
    pcVar2 = p->next;
    p->next = pcVar2 + 1;
    ordinary(p,(int)*pcVar2);
    break;
  case '^':
    doemit(p,0xc000000,0);
    p->g->iflags = p->g->iflags | 1;
    p->g->nbol = p->g->nbol + 1;
    bVar4 = true;
    break;
  case '{':
    if ((p->next < p->end) && (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)*p->next] & 0x800) != 0))
    {
      seterr(p,0xd);
    }
  default:
    ordinary(p,(int)cVar1);
    break;
  case '|':
    seterr(p,0xe);
  }
  if ((p->next < p->end) &&
     ((((cVar1 = *p->next, cVar1 == '*' || (cVar1 == '+')) || (cVar1 == '?')) ||
      (((cVar1 == '{' && (p->next + 1 < p->end)) &&
       (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)p->next[1]] & 0x800) != 0)))))) {
    p->next = p->next + 1;
    if (bVar4) {
      seterr(p,0xd);
    }
    if (cVar1 == '*') {
      doinsert(p,0x24000000,(p->slen - pos_00) + 1,pos_00);
      doemit(p,0x28000000,p->slen - pos_00);
      doinsert(p,0x2c000000,(p->slen - pos_00) + 1,pos_00);
      doemit(p,0x30000000,p->slen - pos_00);
    }
    else if (cVar1 == '+') {
      doinsert(p,0x24000000,(p->slen - pos_00) + 1,pos_00);
      doemit(p,0x28000000,p->slen - pos_00);
    }
    else if (cVar1 == '?') {
      doinsert(p,0x3c000000,(p->slen - pos_00) + 1,pos_00);
      doemit(p,0x40000000,p->slen - pos_00);
      dofwd(p,pos_00,p->slen - pos_00);
      doemit(p,0x44000000,0);
      dofwd(p,p->slen + -1,p->slen - (p->slen + -1));
      doemit(p,0x48000000,p->slen - (p->slen + -2));
    }
    else if (cVar1 == '{') {
      from = p_count(p);
      subno._0_4_ = from;
      if ((p->next < p->end) && (*p->next == ',')) {
        p->next = p->next + 1;
        ppuVar3 = __ctype_b_loc();
        if (((*ppuVar3)[(int)*p->next] & 0x800) == 0) {
          subno._0_4_ = 0x100;
        }
        else {
          subno._0_4_ = p_count(p);
          if ((int)subno < from) {
            seterr(p,10);
          }
        }
      }
      repeat(p,pos_00,from,(int)subno);
      if ((p->next < p->end) && (*p->next == '}')) {
        p->next = p->next + 1;
      }
      else {
        while( true ) {
          bVar4 = false;
          if (p->next < p->end) {
            bVar4 = *p->next != '}';
          }
          if (!bVar4) break;
          p->next = p->next + 1;
        }
        if (p->end <= p->next) {
          seterr(p,9);
        }
        seterr(p,10);
      }
    }
    if ((p->next < p->end) &&
       ((((cVar1 = *p->next, cVar1 == '*' || (cVar1 == '+')) || (cVar1 == '?')) ||
        (((cVar1 == '{' && (p->next + 1 < p->end)) &&
         (ppuVar3 = __ctype_b_loc(), ((*ppuVar3)[(int)p->next[1]] & 0x800) != 0)))))) {
      seterr(p,0xd);
    }
  }
  return;
}

Assistant:

static void
p_ere_exp(p)
struct parse *p;
{
	char c;
	sopno pos;
	int count;
	int count2;
	sopno subno;
	int wascaret = 0;

	assert(MORE());		/* caller should have ensured this */
	c = GETNEXT();

	pos = HERE();
	switch (c) {
	case '(':
		REQUIRE(MORE(), REG_EPAREN);
		p->g->nsub++;
		subno = (sopno)p->g->nsub;
		if (subno < NPAREN)
			p->pbegin[subno] = HERE();
		EMIT(OLPAREN, subno);
		if (!SEE(')'))
			p_ere(p, ')');
		if (subno < NPAREN) {
			p->pend[subno] = HERE();
			assert(p->pend[subno] != 0);
		}
		EMIT(ORPAREN, subno);
		MUSTEAT(')', REG_EPAREN);
		break;
#ifndef POSIX_MISTAKE
	case ')':		/* happens only if no current unmatched ( */
		/*
		 * You may ask, why the ifndef?  Because I didn't notice
		 * this until slightly too late for 1003.2, and none of the
		 * other 1003.2 regular-expression reviewers noticed it at
		 * all.  So an unmatched ) is legal POSIX, at least until
		 * we can get it fixed.
		 */
		seterr(p, REG_EPAREN);
		break;
#endif
	case '^':
		EMIT(OBOL, 0);
		p->g->iflags |= USEBOL;
		p->g->nbol++;
		wascaret = 1;
		break;
	case '$':
		EMIT(OEOL, 0);
		p->g->iflags |= USEEOL;
		p->g->neol++;
		break;
	case '|':
		seterr(p, REG_EMPTY);
		break;
	case '*':
	case '+':
	case '?':
		seterr(p, REG_BADRPT);
		break;
	case '.':
		if (p->g->cflags&REG_NEWLINE)
			nonnewline(p);
		else
			EMIT(OANY, 0);
		break;
	case '[':
		p_bracket(p);
		break;
	case '\\':
		REQUIRE(MORE(), REG_EESCAPE);
		c = GETNEXT();
		ordinary(p, c);
		break;
	case '{':		/* okay as ordinary except if digit follows */
		REQUIRE(!MORE() || !isdigit(PEEK()), REG_BADRPT);
		/* FALLTHROUGH */
	default:
		ordinary(p, c);
		break;
	}

	if (!MORE())
		return;
	c = PEEK();
	/* we call { a repetition if followed by a digit */
	if (!( c == '*' || c == '+' || c == '?' ||
				(c == '{' && MORE2() && isdigit(PEEK2())) ))
		return;		/* no repetition, we're done */
	NEXT();

	REQUIRE(!wascaret, REG_BADRPT);
	switch (c) {
	case '*':	/* implemented as +? */
		/* this case does not require the (y|) trick, noKLUDGE */
		INSERT(OPLUS_, pos);
		ASTERN(O_PLUS, pos);
		INSERT(OQUEST_, pos);
		ASTERN(O_QUEST, pos);
		break;
	case '+':
		INSERT(OPLUS_, pos);
		ASTERN(O_PLUS, pos);
		break;
	case '?':
		/* KLUDGE: emit y? as (y|) until subtle bug gets fixed */
		INSERT(OCH_, pos);		/* offset slightly wrong */
		ASTERN(OOR1, pos);		/* this one's right */
		AHEAD(pos);			/* fix the OCH_ */
		EMIT(OOR2, 0);			/* offset very wrong... */
		AHEAD(THERE());			/* ...so fix it */
		ASTERN(O_CH, THERETHERE());
		break;
	case '{':
		count = p_count(p);
		if (EAT(',')) {
			if (isdigit(PEEK())) {
				count2 = p_count(p);
				REQUIRE(count <= count2, REG_BADBR);
			} else		/* single number with comma */
				count2 = INFINITY;
		} else		/* just a single number */
			count2 = count;
		repeat(p, pos, count, count2);
		if (!EAT('}')) {	/* error heuristics */
			while (MORE() && PEEK() != '}')
				NEXT();
			REQUIRE(MORE(), REG_EBRACE);
			seterr(p, REG_BADBR);
		}
		break;
	}

	if (!MORE())
		return;
	c = PEEK();
	if (!( c == '*' || c == '+' || c == '?' ||
				(c == '{' && MORE2() && isdigit(PEEK2())) ) )
		return;
	seterr(p, REG_BADRPT);
}